

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Output.cxx
# Opt level: O1

int __thiscall Fl_Value_Output::handle(Fl_Value_Output *this,int event)

{
  int iVar1;
  int iVar2;
  int n;
  double dVar3;
  
  dVar3 = (this->super_Fl_Valuator).A / (double)(this->super_Fl_Valuator).B;
  iVar2 = 0;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    iVar2 = 1;
    switch(event) {
    case 1:
      handle::drag = Fl::e_keysym + -0xfee8;
      handle::ix = Fl::e_x;
      (this->super_Fl_Valuator).previous_value_ = (this->super_Fl_Valuator).value_;
      break;
    case 2:
      Fl_Valuator::handle_release(&this->super_Fl_Valuator);
      break;
    case 5:
      iVar1 = Fl::e_x - handle::ix;
      n = 0;
      if (iVar1 < -5) {
        n = iVar1 + 5;
      }
      if (5 < iVar1) {
        n = iVar1 + -5;
      }
      if (handle::drag == 2) {
        n = n * 10;
      }
      else if (handle::drag == 3) {
        n = n * 100;
      }
      dVar3 = Fl_Valuator::increment
                        (&this->super_Fl_Valuator,(this->super_Fl_Valuator).previous_value_,n);
      dVar3 = Fl_Valuator::round(&this->super_Fl_Valuator,dVar3);
      if (this->soft_ == '\0') {
        dVar3 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar3);
      }
      else {
        dVar3 = Fl_Valuator::softclamp(&this->super_Fl_Valuator,dVar3);
      }
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar3);
    }
  }
  return iVar2;
}

Assistant:

int Fl_Value_Output::handle(int event) {
  if (!step()) return 0;
  double v;
  int delta;
  int mx = Fl::event_x();
  static int ix, drag;
  switch (event) {
  case FL_PUSH:
    ix = mx;
    drag = Fl::event_button();
    handle_push();
    return 1;
  case FL_DRAG:
    delta = Fl::event_x()-ix;
    if (delta > 5) delta -= 5;
    else if (delta < -5) delta += 5;
    else delta = 0;
    switch (drag) {
    case 3: v = increment(previous_value(),delta*100); break;
    case 2: v = increment(previous_value(),delta*10); break;
    default:v = increment(previous_value(),delta); break;
    }
    v = round(v);
    handle_drag(soft()?softclamp(v):clamp(v));;
    return 1;
  case FL_RELEASE:
    handle_release();
    return 1;
  case FL_ENTER :
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}